

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.c
# Opt level: O3

void quicly_sendbuf_shift(quicly_stream_t *stream,quicly_sendbuf_t *sb,size_t delta)

{
  size_t *psVar1;
  quicly_sendbuf_vec_t *pqVar2;
  code *pcVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (delta != 0) {
    lVar5 = 0;
    uVar7 = 0;
    do {
      if ((sb->vecs).size <= uVar7) {
        __assert_fail("i < sb->vecs.size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/streambuf.c"
                      ,0x3a,
                      "void quicly_sendbuf_shift(quicly_stream_t *, quicly_sendbuf_t *, size_t)");
      }
      pqVar2 = (sb->vecs).entries;
      uVar4 = *(long *)((long)&pqVar2->len + lVar5) - sb->off_in_first_vec;
      uVar6 = delta - uVar4;
      if (delta < uVar4) {
        sb->off_in_first_vec = sb->off_in_first_vec + delta;
        break;
      }
      pcVar3 = *(code **)(*(long *)((long)&pqVar2->cb + lVar5) + 8);
      if (pcVar3 != (code *)0x0) {
        (*pcVar3)();
      }
      sb->off_in_first_vec = 0;
      uVar7 = uVar7 + 1;
      lVar5 = lVar5 + 0x18;
      delta = uVar6;
    } while (uVar6 != 0);
    if (uVar7 != 0) {
      pqVar2 = (sb->vecs).entries;
      lVar5 = (sb->vecs).size - uVar7;
      if (lVar5 == 0) {
        free(pqVar2);
        (sb->vecs).entries = (quicly_sendbuf_vec_t *)0x0;
        (sb->vecs).size = 0;
        (sb->vecs).capacity = 0;
      }
      else {
        memmove(pqVar2,pqVar2 + uVar7,lVar5 * 0x18);
        psVar1 = &(sb->vecs).size;
        *psVar1 = *psVar1 - uVar7;
      }
    }
  }
  quicly_stream_sync_sendbuf(stream,0);
  return;
}

Assistant:

void quicly_sendbuf_shift(quicly_stream_t *stream, quicly_sendbuf_t *sb, size_t delta)
{
    size_t i;

    for (i = 0; delta != 0; ++i) {
        assert(i < sb->vecs.size);
        quicly_sendbuf_vec_t *first_vec = sb->vecs.entries + i;
        size_t bytes_in_first_vec = first_vec->len - sb->off_in_first_vec;
        if (delta < bytes_in_first_vec) {
            sb->off_in_first_vec += delta;
            break;
        }
        delta -= bytes_in_first_vec;
        if (first_vec->cb->discard_vec != NULL)
            first_vec->cb->discard_vec(first_vec);
        sb->off_in_first_vec = 0;
    }
    if (i != 0) {
        if (sb->vecs.size != i) {
            memmove(sb->vecs.entries, sb->vecs.entries + i, (sb->vecs.size - i) * sizeof(*sb->vecs.entries));
            sb->vecs.size -= i;
        } else {
            free(sb->vecs.entries);
            sb->vecs.entries = NULL;
            sb->vecs.size = 0;
            sb->vecs.capacity = 0;
        }
    }
    quicly_stream_sync_sendbuf(stream, 0);
}